

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O2

void __thiscall QCache<QString,_QIcon>::trim(QCache<QString,_QIcon> *this,qsizetype m)

{
  QCache<QString,_QIcon> *__name;
  
  while ((__name = (QCache<QString,_QIcon> *)(this->chain).prev, __name != this && (m < this->total)
         )) {
    unlink(this,(char *)__name);
  }
  return;
}

Assistant:

void trim(qsizetype m) noexcept(std::is_nothrow_destructible_v<Node>)
    {
        while (chain.prev != &chain && total > m) {
            Node *n = static_cast<Node *>(chain.prev);
            unlink(n);
        }
    }